

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dynamics.cpp
# Opt level: O1

bool __thiscall
iDynTree::ArticulatedBodyAlgorithmInternalBuffers::isConsistent
          (ArticulatedBodyAlgorithmInternalBuffers *this,Model *model)

{
  bool bVar1;
  
  bVar1 = DOFSpatialMotionArray::isConsistent(&this->S,model);
  if (bVar1) {
    bVar1 = DOFSpatialForceArray::isConsistent(&this->U,model);
    if (bVar1) {
      bVar1 = JointDOFsDoubleArray::isConsistent(&this->D,model);
      if (bVar1) {
        bVar1 = JointDOFsDoubleArray::isConsistent(&this->u,model);
        if (bVar1) {
          bVar1 = LinkVelArray::isConsistent(&this->linksVel,model);
          if (bVar1) {
            bVar1 = LinkAccArray::isConsistent(&this->linksBiasAcceleration,model);
            if (bVar1) {
              bVar1 = LinkArticulatedBodyInertias::isConsistent(&this->linkABIs,model);
              if (bVar1) {
                bVar1 = LinkWrenches::isConsistent(&this->linksBiasWrench,model);
                return bVar1;
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ArticulatedBodyAlgorithmInternalBuffers::isConsistent(const Model& model)
{
    bool ok = true;

    ok = ok && S.isConsistent(model);
    ok = ok && U.isConsistent(model);
    ok = ok && D.isConsistent(model);
    ok = ok && u.isConsistent(model);
    ok = ok && linksVel.isConsistent(model);
    ok = ok && linksBiasAcceleration.isConsistent(model);
    ok = ok && linkABIs.isConsistent(model);
    ok = ok && linksBiasWrench.isConsistent(model);

    return ok;
}